

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_normalize(uchar *sig,size_t sig_len,uchar *bytes_out,size_t len)

{
  secp256k1_context *ctx_00;
  int iVar1;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_signature sig_low;
  secp256k1_ecdsa_signature sig_secp;
  size_t len_local;
  uchar *bytes_out_local;
  size_t sig_len_local;
  uchar *sig_local;
  
  ctx_00 = secp256k1_context_no_precomp;
  bVar2 = false;
  if ((((sig != (uchar *)0x0) && (bVar2 = false, sig_len == 0x40)) &&
      (bVar2 = false, bytes_out != (uchar *)0x0)) && (bVar2 = false, len == 0x40)) {
    iVar1 = secp256k1_ecdsa_signature_parse_compact
                      (secp256k1_context_no_precomp,
                       (secp256k1_ecdsa_signature *)(sig_low.data + 0x38),sig);
    bVar2 = iVar1 != 0;
  }
  if (bVar2) {
    secp256k1_ecdsa_signature_normalize
              (ctx_00,(secp256k1_ecdsa_signature *)&ctx,
               (secp256k1_ecdsa_signature *)(sig_low.data + 0x38));
    iVar1 = secp256k1_ecdsa_signature_serialize_compact
                      (ctx_00,bytes_out,(secp256k1_ecdsa_signature *)&ctx);
    bVar2 = iVar1 != 0;
  }
  if ((!bVar2) && (bytes_out != (uchar *)0x0)) {
    wally_clear(bytes_out,len);
  }
  wally_clear_2(sig_low.data + 0x38,0x40,&ctx,0x40);
  iVar1 = -2;
  if (bVar2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_ec_sig_normalize(const unsigned char *sig, size_t sig_len,
                           unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp, sig_low;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    ok = sig && sig_len == EC_SIGNATURE_LEN &&
         bytes_out && len == EC_SIGNATURE_LEN &&
         secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig);

    if (ok) {
        /* Note no error is returned, just whether the sig was changed */
        secp256k1_ecdsa_signature_normalize(ctx, &sig_low, &sig_secp);

        ok = secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out,
                                                         &sig_low);
    }

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear_2(&sig_secp, sizeof(sig_secp), &sig_low, sizeof(sig_low));
    return ok ? WALLY_OK : WALLY_EINVAL;
}